

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  LogMessage *pLVar1;
  Rep *pRVar2;
  int iVar3;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x7ff);
    pLVar1 = LogMessage::operator<<(&local_60,"CHECK failed: GetArena() == NULL: ");
    pLVar1 = LogMessage::operator<<
                       (pLVar1,
                        "AddCleared() can only be used on a RepeatedPtrField not on an arena.");
    LogFinisher::operator=(&local_21,pLVar1);
    LogMessage::~LogMessage(&local_60);
  }
  pRVar2 = this->rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar3 = this->total_size_;
  }
  else {
    iVar3 = pRVar2->allocated_size;
    if (iVar3 != this->total_size_) goto LAB_0028cb82;
  }
  Reserve(this,iVar3 + 1);
  pRVar2 = this->rep_;
  iVar3 = pRVar2->allocated_size;
LAB_0028cb82:
  pRVar2->allocated_size = iVar3 + 1;
  pRVar2->elements[iVar3] = value;
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::AddCleared(
    typename TypeHandler::Type* value) {
  GOOGLE_DCHECK(GetArena() == NULL)
      << "AddCleared() can only be used on a RepeatedPtrField not on an arena.";
  GOOGLE_DCHECK(TypeHandler::GetArena(value) == NULL)
      << "AddCleared() can only accept values not on an arena.";
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  rep_->elements[rep_->allocated_size++] = value;
}